

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O0

void __thiscall QPDFJob::writeJSON(QPDFJob *this,QPDF *pdf)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar1;
  element_type *peVar2;
  ulong uVar3;
  element_type *peVar4;
  element_type *p;
  QPDFLogger local_a8;
  allocator<char> local_91;
  string local_90;
  shared_ptr<Pl_StdioFile> local_70;
  FILE *local_60;
  shared_ptr<QUtil::FileCloser> local_58 [2];
  undefined1 local_38 [8];
  shared_ptr<Pipeline> fp;
  shared_ptr<QUtil::FileCloser> fc;
  QPDF *pdf_local;
  QPDFJob *this_local;
  
  std::shared_ptr<QUtil::FileCloser>::shared_ptr
            ((shared_ptr<QUtil::FileCloser> *)
             &fp.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<Pipeline>::shared_ptr((shared_ptr<Pipeline> *)local_38);
  peVar1 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  peVar2 = std::__shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>::get
                     (&(peVar1->outfilename).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>);
  if (peVar2 == (element_type *)0x0) {
    peVar1 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    if (peVar1->json_stream_data == qpdf_sj_file) {
      std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 this);
      uVar3 = std::__cxx11::string::empty();
      if ((uVar3 & 1) != 0) {
        QTC::TC("qpdf","QPDFJob need json-stream-prefix for stdout",0);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_90,
                   "please specify --json-stream-prefix since the input file name is unknown",
                   &local_91);
        usage(&local_90);
        std::__cxx11::string::~string((string *)&local_90);
        std::allocator<char>::~allocator(&local_91);
        goto LAB_0020444a;
      }
    }
    QTC::TC("qpdf","QPDFJob write json to stdout",0);
    peVar1 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    peVar4 = std::__shared_ptr_access<QPDFLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )peVar1);
    QPDFLogger::saveToStandardOutput(peVar4,true);
    peVar1 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    peVar4 = std::__shared_ptr_access<QPDFLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )peVar1);
    QPDFLogger::getSave(&local_a8,SUB81(peVar4,0));
    std::shared_ptr<Pipeline>::operator=
              ((shared_ptr<Pipeline> *)local_38,(shared_ptr<Pipeline> *)&local_a8);
    std::shared_ptr<Pipeline>::~shared_ptr((shared_ptr<Pipeline> *)&local_a8);
  }
  else {
    QTC::TC("qpdf","QPDFJob write json to file",0);
    std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               this);
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) != 0) {
      peVar1 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      peVar2 = std::__shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>::get
                         (&(peVar1->outfilename).
                           super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>);
      peVar1 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      std::__cxx11::string::operator=((string *)&peVar1->json_stream_prefix,peVar2);
    }
    peVar1 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    peVar2 = std::__shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>::get
                       (&(peVar1->outfilename).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>)
    ;
    local_60 = QUtil::safe_fopen(peVar2,"w");
    std::make_shared<QUtil::FileCloser,_IO_FILE*>((_IO_FILE **)local_58);
    this_00 = &fp.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    std::shared_ptr<QUtil::FileCloser>::operator=((shared_ptr<QUtil::FileCloser> *)this_00,local_58)
    ;
    std::shared_ptr<QUtil::FileCloser>::~shared_ptr(local_58);
    std::__shared_ptr_access<QUtil::FileCloser,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<QUtil::FileCloser,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               this_00);
    std::make_shared<Pl_StdioFile,char_const(&)[12],_IO_FILE*&>
              ((char (*) [12])&local_70,(_IO_FILE **)0x427078);
    std::shared_ptr<Pipeline>::operator=((shared_ptr<Pipeline> *)local_38,&local_70);
    std::shared_ptr<Pl_StdioFile>::~shared_ptr(&local_70);
  }
LAB_0020444a:
  p = std::__shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>::get
                ((__shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2> *)local_38);
  doJSON(this,pdf,p);
  std::shared_ptr<Pipeline>::~shared_ptr((shared_ptr<Pipeline> *)local_38);
  std::shared_ptr<QUtil::FileCloser>::~shared_ptr
            ((shared_ptr<QUtil::FileCloser> *)
             &fp.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

void
QPDFJob::writeJSON(QPDF& pdf)
{
    // File pipeline must have block scope so it will be closed after write.
    std::shared_ptr<QUtil::FileCloser> fc;
    std::shared_ptr<Pipeline> fp;
    if (m->outfilename.get()) {
        QTC::TC("qpdf", "QPDFJob write json to file");
        if (m->json_stream_prefix.empty()) {
            m->json_stream_prefix = m->outfilename.get();
        }
        fc = std::make_shared<QUtil::FileCloser>(QUtil::safe_fopen(m->outfilename.get(), "w"));
        fp = std::make_shared<Pl_StdioFile>("json output", fc->f);
    } else if ((m->json_stream_data == qpdf_sj_file) && m->json_stream_prefix.empty()) {
        QTC::TC("qpdf", "QPDFJob need json-stream-prefix for stdout");
        usage("please specify --json-stream-prefix since the input file name is unknown");
    } else {
        QTC::TC("qpdf", "QPDFJob write json to stdout");
        m->log->saveToStandardOutput(true);
        fp = m->log->getSave();
    }
    doJSON(pdf, fp.get());
}